

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  ArgumentParser *this_local;
  
  std::
  vector<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
  ::~vector(&this->m_mutually_exclusive_groups);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
  ::~map(&this->m_subparser_used);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
  ::~map(&this->m_subparser_map);
  std::__cxx11::
  list<std::reference_wrapper<argparse::ArgumentParser>,_std::allocator<std::reference_wrapper<argparse::ArgumentParser>_>_>
  ::~list(&this->m_subparsers);
  std::__cxx11::string::~string((string *)&this->m_parser_path);
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~map(&this->m_argument_map);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::~list
            (&this->m_optional_arguments);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::~list
            (&this->m_positional_arguments);
  std::__cxx11::string::~string((string *)&this->m_assign_chars);
  std::__cxx11::string::~string((string *)&this->m_prefix_chars);
  std::__cxx11::string::~string((string *)&this->m_epilog);
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)&this->m_version);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~ArgumentParser() = default;